

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map2json.c
# Opt level: O0

long map2json_checkArrayObject(char *key)

{
  char *pcVar1;
  char *pcVar2;
  char *in_RDI;
  char *ptr;
  
  pcVar1 = strchr(in_RDI,0x5b);
  if ((pcVar1 != (char *)0x0) && (pcVar2 = strchr(in_RDI,0x5d), pcVar2 != (char *)0x0)) {
    return (long)pcVar1 - (long)in_RDI;
  }
  return 0;
}

Assistant:

static long map2json_checkArrayObject(char *key) {
	DEBUG_TEXT("map2json_checkArrayObject(%s)... ", key);
	char *ptr = strchr(key, JSON2MAP_MAP_ARRAY_START);
	if ( ptr && strchr(key, JSON2MAP_MAP_ARRAY_END) ) {
		return ptr - key;
	}
	DEBUG_TEXT("map2json_checkArrayObject(%s)... ", key);
	return 0;
}